

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O0

int cubeb_device_collection_destroy(cubeb *context,cubeb_device_collection *collection)

{
  long *in_RSI;
  long *in_RDI;
  int r;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == (long *)0x0)) {
    local_4 = -3;
  }
  else if (*(long *)(*in_RDI + 0x30) == 0) {
    local_4 = -4;
  }
  else if (*in_RSI == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI);
    if (local_4 == 0) {
      *in_RSI = 0;
      in_RSI[1] = 0;
    }
  }
  return local_4;
}

Assistant:

int
cubeb_device_collection_destroy(cubeb * context,
                                cubeb_device_collection * collection)
{
  int r;

  if (context == NULL || collection == NULL)
    return CUBEB_ERROR_INVALID_PARAMETER;

  if (!context->ops->device_collection_destroy)
    return CUBEB_ERROR_NOT_SUPPORTED;

  if (!collection->device)
    return CUBEB_OK;

  r = context->ops->device_collection_destroy(context, collection);
  if (r == CUBEB_OK) {
    collection->device = NULL;
    collection->count = 0;
  }

  return r;
}